

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

string * __thiscall
(anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
          (string *__return_storage_ptr__,void *this,cmInstallCommandArguments *args)

{
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_INSTALL_BINDIR",&local_59);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"bin",&local_5a);
  anon_unknown.dwarf_7b5804::Helper::GetDestination
            (__return_storage_ptr__,(Helper *)this,args,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Helper::GetRuntimeDestination(
  const cmInstallCommandArguments* args) const
{
  return this->GetDestination(args, "CMAKE_INSTALL_BINDIR", "bin");
}